

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int mbedtls_ecp_muladd(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,
                      mbedtls_ecp_point *P,mbedtls_mpi *n,mbedtls_ecp_point *Q)

{
  int iVar1;
  
  iVar1 = mbedtls_ecp_muladd_restartable(grp,R,m,P,n,Q,(mbedtls_ecp_restart_ctx *)0x0);
  return iVar1;
}

Assistant:

int mbedtls_ecp_muladd( mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
             const mbedtls_mpi *m, const mbedtls_ecp_point *P,
             const mbedtls_mpi *n, const mbedtls_ecp_point *Q )
{
    ECP_VALIDATE_RET( grp != NULL );
    ECP_VALIDATE_RET( R   != NULL );
    ECP_VALIDATE_RET( m   != NULL );
    ECP_VALIDATE_RET( P   != NULL );
    ECP_VALIDATE_RET( n   != NULL );
    ECP_VALIDATE_RET( Q   != NULL );
    return( mbedtls_ecp_muladd_restartable( grp, R, m, P, n, Q, NULL ) );
}